

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_initialize_event.cpp
# Opt level: O0

void __thiscall
duckdb::PipelineInitializeEvent::PipelineInitializeEvent
          (PipelineInitializeEvent *this,shared_ptr<duckdb::Pipeline,_true> *pipeline_p)

{
  shared_ptr<duckdb::Pipeline,_true> *in_RDI;
  shared_ptr<duckdb::Pipeline,_true> *in_stack_ffffffffffffffb8;
  shared_ptr<duckdb::Pipeline,_true> *in_stack_ffffffffffffffd8;
  BasePipelineEvent *in_stack_ffffffffffffffe0;
  
  shared_ptr<duckdb::Pipeline,_true>::shared_ptr(in_RDI,in_stack_ffffffffffffffb8);
  BasePipelineEvent::BasePipelineEvent(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  shared_ptr<duckdb::Pipeline,_true>::~shared_ptr((shared_ptr<duckdb::Pipeline,_true> *)0x99a932);
  (in_RDI->internal).super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__PipelineInitializeEvent_0350e188;
  return;
}

Assistant:

PipelineInitializeEvent::PipelineInitializeEvent(shared_ptr<Pipeline> pipeline_p)
    : BasePipelineEvent(std::move(pipeline_p)) {
}